

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void absl::lts_20250127::container_internal::DeallocateStandard<4ul>
               (CommonFields *common,PolicyFunctions *policy)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  HashtablezInfoHandle local_1a;
  allocator<char> local_19;
  PolicyFunctions *pPStack_18;
  allocator<char> alloc;
  PolicyFunctions *policy_local;
  CommonFields *common_local;
  
  pPStack_18 = policy;
  pvVar1 = CommonFields::slot_array(common);
  sVar3 = pPStack_18->slot_size;
  sVar2 = CommonFields::capacity(common);
  SanitizerUnpoisonMemoryRegion(pvVar1,sVar3 * sVar2);
  std::allocator<char>::allocator();
  CommonFields::infoz(common);
  HashtablezInfoHandle::Unregister(&local_1a);
  pvVar1 = CommonFields::backing_array_start(common);
  sVar3 = CommonFields::alloc_size(common,pPStack_18->slot_size,4);
  Deallocate<8ul,std::allocator<char>>(&local_19,pvVar1,sVar3);
  std::allocator<char>::~allocator(&local_19);
  return;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE void DeallocateStandard(CommonFields& common,
                                                const PolicyFunctions& policy) {
  // Unpoison before returning the memory to the allocator.
  SanitizerUnpoisonMemoryRegion(common.slot_array(),
                                policy.slot_size * common.capacity());

  std::allocator<char> alloc;
  common.infoz().Unregister();
  Deallocate<BackingArrayAlignment(AlignOfSlot)>(
      &alloc, common.backing_array_start(),
      common.alloc_size(policy.slot_size, AlignOfSlot));
}